

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O2

int run_test_ip6_pton(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  in6_addr addr;
  
  iVar1 = uv_inet_pton(10,"::",&addr);
  if (iVar1 == 0) {
    iVar1 = uv_inet_pton(10,"::%en1",&addr);
    if (iVar1 == 0) {
      iVar1 = uv_inet_pton(10,"::%%%%",&addr);
      if (iVar1 == 0) {
        iVar1 = uv_inet_pton(10,"::%en1:1.2.3.4",&addr);
        if (iVar1 == 0) {
          iVar1 = uv_inet_pton(10,"::1",&addr);
          if (iVar1 == 0) {
            iVar1 = uv_inet_pton(10,"::1%en1",&addr);
            if (iVar1 == 0) {
              iVar1 = uv_inet_pton(10,"::1%%%%",&addr);
              if (iVar1 == 0) {
                iVar1 = uv_inet_pton(10,"::1%en1:1.2.3.4",&addr);
                if (iVar1 == 0) {
                  iVar1 = uv_inet_pton(10,"fe80::1",&addr);
                  if (iVar1 == 0) {
                    iVar1 = uv_inet_pton(10,"fe80::1%en1",&addr);
                    if (iVar1 == 0) {
                      iVar1 = uv_inet_pton(10,"fe80::1%%%%",&addr);
                      if (iVar1 == 0) {
                        iVar1 = uv_inet_pton(10,"fe80::1%en1:1.2.3.4",&addr);
                        if (iVar1 == 0) {
                          iVar1 = uv_inet_pton(10,"fe80::",&addr);
                          if (iVar1 == 0) {
                            iVar1 = uv_inet_pton(10,"fe80::%en1",&addr);
                            if (iVar1 == 0) {
                              iVar1 = uv_inet_pton(10,"fe80::%%%%",&addr);
                              if (iVar1 == 0) {
                                iVar1 = uv_inet_pton(10,"fe80::%en1:1.2.3.4",&addr);
                                if (iVar1 == 0) {
                                  iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a",&addr);
                                  if (iVar1 == 0) {
                                    iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%en1",&addr);
                                    if (iVar1 == 0) {
                                      iVar1 = uv_inet_pton(10,"fe80::2acf:daff:fedd:342a%%%%",&addr)
                                      ;
                                      if (iVar1 == 0) {
                                        iVar1 = uv_inet_pton(10,
                                                  "fe80::2acf:daff:fedd:342a%en1:1.2.3.4",&addr);
                                        if (iVar1 == 0) {
                                          iVar1 = uv_inet_pton(10,"fe80:0:0:0:2acf:daff:fedd:342a",
                                                               &addr);
                                          if (iVar1 == 0) {
                                            iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a%en1",&addr);
                                            if (iVar1 == 0) {
                                              iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a%%%%",&addr);
                                              if (iVar1 == 0) {
                                                iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a%en1:1.2.3.4",&addr
                                                  );
                                                if (iVar1 == 0) {
                                                  iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:1.2.3.4",&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:1.2.3.4%en1",&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:1.2.3.4%%%%",&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:1.2.3.4%en1:1.2.3.4",&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255",
                                                  &addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%%%%"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255%en1:1.2.3.4"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    iVar1 = uv_inet_pton(10,":::1",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \":::1\", &addr)";
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,":::1%en1",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \":::1\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,":::1%%%%",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \":::1\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,":::1%en1:1.2.3.4",&addr
                                                                        );
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \":::1\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,"abcde::1",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"abcde::1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,"abcde::1%en1",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,"abcde::1%%%%",&addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,"abcde::1%en1:1.2.3.4",
                                                                         &addr);
                                                    if (iVar1 == 0) {
                                                      pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"abcde::1\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a:5678",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a:5678%en1",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a:5678%%%%",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:fedd:342a:5678%en1:1.2.3.4",
                                                  &addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a:5678\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:abcd:1.2.3.4",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:abcd:1.2.3.4%%%%",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:0:2acf:daff:abcd:1.2.3.4%en1:1.2.3.4",
                                                  &addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:abcd:1.2.3.4\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:2acf:daff:1.2.3.4.5",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:2acf:daff:1.2.3.4.5%en1",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:2acf:daff:1.2.3.4.5%%%%",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "fe80:0:0:2acf:daff:1.2.3.4.5%en1:1.2.3.4",&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"fe80:0:0:2acf:daff:1.2.3.4.5\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%%%%"
                                                  ,&addr);
                                                  if (iVar1 == 0) {
                                                    pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    iVar1 = uv_inet_pton(10,
                                                  "ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255%en1:1.2.3.4"
                                                  ,&addr);
                                                  if (iVar1 != 0) {
                                                    puVar2 = uv_default_loop();
                                                    close_loop(puVar2);
                                                    puVar2 = uv_default_loop();
                                                    iVar1 = uv_loop_close(puVar2);
                                                    if (iVar1 == 0) {
                                                      return 0;
                                                    }
                                                    pcVar4 = "0 == uv_loop_close(uv_default_loop())"
                                                    ;
                                                    uVar3 = 0x9d;
                                                    goto LAB_00135a6c;
                                                  }
                                                  pcVar4 = 
                                                  "0 != uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255.255\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  uVar3 = 0x9b;
                                                  goto LAB_00135a6c;
                                                  }
                                                  pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"ffff:ffff:ffff:ffff:ffff:ffff:255.255.255.255\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%%%%\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\" \"%en1\", &addr)"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:1.2.3.4\", &addr)"
                                                  ;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = 
                                                  "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%en1:1.2.3.4\", &addr)"
                                                  ;
                                                }
                                              }
                                              else {
                                                pcVar4 = 
                                                "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%%%%\", &addr)"
                                                ;
                                              }
                                            }
                                            else {
                                              pcVar4 = 
                                              "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\" \"%en1\", &addr)"
                                              ;
                                            }
                                          }
                                          else {
                                            pcVar4 = 
                                            "0 == uv_inet_pton(AF_INET6, \"fe80:0:0:0:2acf:daff:fedd:342a\", &addr)"
                                            ;
                                          }
                                        }
                                        else {
                                          pcVar4 = 
                                          "0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%en1:1.2.3.4\", &addr)"
                                          ;
                                        }
                                      }
                                      else {
                                        pcVar4 = 
                                        "0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%%%%\", &addr)"
                                        ;
                                      }
                                    }
                                    else {
                                      pcVar4 = 
                                      "0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\" \"%en1\", &addr)"
                                      ;
                                    }
                                  }
                                  else {
                                    pcVar4 = 
                                    "0 == uv_inet_pton(AF_INET6, \"fe80::2acf:daff:fedd:342a\", &addr)"
                                    ;
                                  }
                                }
                                else {
                                  pcVar4 = 
                                  "0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%en1:1.2.3.4\", &addr)";
                                }
                              }
                              else {
                                pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%%%%\", &addr)";
                              }
                            }
                            else {
                              pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::\" \"%en1\", &addr)";
                            }
                          }
                          else {
                            pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::\", &addr)";
                          }
                        }
                        else {
                          pcVar4 = 
                          "0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%en1:1.2.3.4\", &addr)";
                        }
                      }
                      else {
                        pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%%%%\", &addr)";
                      }
                    }
                    else {
                      pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::1\" \"%en1\", &addr)";
                    }
                  }
                  else {
                    pcVar4 = "0 == uv_inet_pton(AF_INET6, \"fe80::1\", &addr)";
                  }
                }
                else {
                  pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::1\" \"%en1:1.2.3.4\", &addr)";
                }
              }
              else {
                pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::1\" \"%%%%\", &addr)";
              }
            }
            else {
              pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::1\" \"%en1\", &addr)";
            }
          }
          else {
            pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::1\", &addr)";
          }
        }
        else {
          pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::\" \"%en1:1.2.3.4\", &addr)";
        }
      }
      else {
        pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::\" \"%%%%\", &addr)";
      }
    }
    else {
      pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::\" \"%en1\", &addr)";
    }
  }
  else {
    pcVar4 = "0 == uv_inet_pton(AF_INET6, \"::\", &addr)";
  }
  uVar3 = 0x9a;
LAB_00135a6c:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(ip6_pton) {
  struct in6_addr addr;

  GOOD_ADDR_LIST(TEST_GOOD)
  BAD_ADDR_LIST(TEST_BAD)

  MAKE_VALGRIND_HAPPY();
  return 0;
}